

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O1

int read_ahead_timestamp(FILE *f,hdr_timespec *timestamp,char expected_terminator)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar7 = 1000000000;
  lVar5 = 0;
  lVar6 = 0;
  do {
    bVar1 = false;
    while( true ) {
      do {
        bVar4 = bVar1;
        iVar2 = fgetc((FILE *)f);
        bVar1 = true;
      } while (iVar2 == 0x2e);
      if (iVar2 == -1) {
        return 0;
      }
      if (iVar2 == 0x2c) {
        timestamp->tv_sec = lVar5;
        timestamp->tv_nsec = lVar7 * lVar6;
        return 1;
      }
      uVar3 = iVar2 - 0x30;
      if (9 < uVar3) {
        return 0;
      }
      if (!bVar4) break;
      lVar6 = (ulong)uVar3 + lVar6 * 10;
      lVar7 = lVar7 / 10;
      bVar1 = true;
    }
    lVar5 = (ulong)uVar3 + lVar5 * 10;
  } while( true );
}

Assistant:

static int read_ahead_timestamp(FILE* f, hdr_timespec* timestamp, char expected_terminator)
{
    int c;
    int is_seconds = 1;
    long sec = 0;
    long nsec = 0;
    long nsec_multipler = 1000000000;

    while (EOF != (c = fgetc(f)))
    {
        if (expected_terminator == c)
        {
            timestamp->tv_sec = sec;
            timestamp->tv_nsec = (nsec * nsec_multipler);
            return 1;
        }
        else if ('.' == c)
        {
            is_seconds = 0;
        }
        else if ('0' <= c && c <= '9')
        {
            if (is_seconds)
            {
                sec = (sec * 10) + (c - '0');
            }
            else
            {
                nsec = (nsec * 10) + (c - '0');
                nsec_multipler /= 10;
            }
        }
        else
        {
            return 0;
        }
    }

    return 0;
}